

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void QConcatenable<QStringBuilder<QStringBuilder<ProString_&,_QString_&>,_ProString_&>_>::
     appendTo<QChar>(type *p,QChar **out)

{
  QConcatenable<QStringBuilder<ProString_&,_QString_&>_>::appendTo<QChar>(&p->a,out);
  QConcatenable<ProString>::appendTo(p->b,out);
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }